

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O3

void __thiscall Clique::add(Clique *this,size_t index)

{
  ulong *puVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  alignment_set_t *paVar5;
  undefined4 extraout_var;
  ulong uVar6;
  
  paVar5 = this->alignment_set;
  if (paVar5->m_num_bits <= index) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Clique::add failure from clique: ",0x21);
    operator<<((ostream *)&std::cout,this);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Capacity: ",10);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    paVar5 = this->alignment_set;
  }
  puVar1 = (paVar5->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + (index >> 6);
  *puVar1 = *puVar1 | 1L << ((byte)index & 0x3f);
  iVar2 = (*this->parent->_vptr_CliqueFinder[5])(this->parent,index);
  uVar3 = AlignmentRecord::getIntervalStart((AlignmentRecord *)CONCAT44(extraout_var,iVar2));
  uVar6 = (ulong)uVar3;
  if (this->leftmost_segment_start < (ulong)uVar3) {
    uVar6 = this->leftmost_segment_start;
  }
  this->leftmost_segment_start = uVar6;
  uVar3 = AlignmentRecord::getIntervalEnd((AlignmentRecord *)CONCAT44(extraout_var,iVar2));
  uVar6 = (ulong)uVar3;
  if ((ulong)uVar3 < this->rightmost_segment_end) {
    uVar6 = this->rightmost_segment_end;
  }
  this->rightmost_segment_end = uVar6;
  this->alignment_count = this->alignment_count + 1;
  return;
}

Assistant:

void Clique::add(size_t index) {
	if (index >= alignment_set->size()) {
		cout << "Clique::add failure from clique: " << *this <<endl;
		cout << "Capacity: " << alignment_set->size() << endl;
	}
	alignment_set->set(index, true);
	const AlignmentRecord& ap = parent.getAlignmentByIndex(index);
	leftmost_segment_start = min(leftmost_segment_start,(size_t)ap.getIntervalStart());
	rightmost_segment_end = max(rightmost_segment_end,(size_t)ap.getIntervalEnd());
	alignment_count += 1;
}